

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool tailmatch(char *cooke_domain,char *hostname)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t hostname_len;
  size_t cookie_domain_len;
  char *hostname_local;
  char *cooke_domain_local;
  
  sVar2 = strlen(cooke_domain);
  sVar3 = strlen(hostname);
  if (sVar3 < sVar2) {
    cooke_domain_local._7_1_ = false;
  }
  else {
    iVar1 = Curl_raw_equal(cooke_domain,hostname + (sVar3 - sVar2));
    if (iVar1 == 0) {
      cooke_domain_local._7_1_ = false;
    }
    else if (sVar3 == sVar2) {
      cooke_domain_local._7_1_ = true;
    }
    else if (hostname[(sVar3 - 1) - sVar2] == '.') {
      cooke_domain_local._7_1_ = true;
    }
    else {
      cooke_domain_local._7_1_ = false;
    }
  }
  return cooke_domain_local._7_1_;
}

Assistant:

static bool tailmatch(const char *cooke_domain, const char *hostname)
{
  size_t cookie_domain_len = strlen(cooke_domain);
  size_t hostname_len = strlen(hostname);

  if(hostname_len < cookie_domain_len)
    return FALSE;

  if(!Curl_raw_equal(cooke_domain, hostname+hostname_len-cookie_domain_len))
    return FALSE;

  /* A lead char of cookie_domain is not '.'.
     RFC6265 4.1.2.3. The Domain Attribute says:
       For example, if the value of the Domain attribute is
       "example.com", the user agent will include the cookie in the Cookie
       header when making HTTP requests to example.com, www.example.com, and
       www.corp.example.com.
   */
  if(hostname_len == cookie_domain_len)
    return TRUE;
  if('.' == *(hostname + hostname_len - cookie_domain_len - 1))
    return TRUE;
  return FALSE;
}